

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateDatatypeValidator.cpp
# Opt level: O1

XMLDateTime * __thiscall
xercesc_4_0::DateDatatypeValidator::parse
          (DateDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  XMLDateTime *this_00;
  
  this_00 = (XMLDateTime *)XMemory::operator_new(0x68,manager);
  XMLDateTime::XMLDateTime(this_00,content,manager);
  XMLDateTime::parseDate(this_00);
  return this_00;
}

Assistant:

XMLDateTime* DateDatatypeValidator::parse(const XMLCh* const content, MemoryManager* const manager)
{
    XMLDateTime *pRetDate = new (manager) XMLDateTime(content, manager);
    Janitor<XMLDateTime> jan(pRetDate);

    try
    {
        pRetDate->parseDate();
    }
    catch(const OutOfMemoryException&)
    {
        jan.release();

        throw;
    }

    return jan.release();
}